

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-contact-ekf-flex-estimator-imu.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::resetCovarianceMatrices
          (FixedContactEKFFlexEstimatorIMU *this)

{
  ExtendedKalmanFilter *this_00;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double *pdVar5;
  char *__function;
  Index outer;
  long lVar6;
  Index inner_1;
  long lVar7;
  double *pdVar8;
  Index outer_2;
  Index inner;
  long lVar9;
  long lVar10;
  Index inner_2;
  ActualDstType actualDst_1;
  undefined4 uVar11;
  undefined4 uVar12;
  Matrix P0;
  assign_op<double,_double> local_59;
  Matrix local_58;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_40;
  Matrix *pMVar4;
  
  iVar3 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  pMVar4 = (Matrix *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])(this);
  local_40.m_rhs.m_rows.m_value = CONCAT44(extraout_var_00,iVar3);
  local_40.m_lhs = pMVar4;
  if ((long)(local_40.m_rhs.m_rows.m_value | (ulong)pMVar4) < 0) {
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_0014b8f4:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
  }
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
            (&this->R_,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&local_40,(assign_op<double,_double> *)&local_58);
  lVar10 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
  if ((2 < lVar10) &&
     (lVar6 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols, 2 < lVar6)) {
    pdVar5 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    lVar7 = 0;
    pdVar8 = pdVar5;
    do {
      lVar9 = 0;
      do {
        uVar11 = 0xa0b5ed8d;
        uVar12 = 0x3eb0c6f7;
        if (lVar7 != lVar9) {
          uVar11 = 0;
          uVar12 = 0;
        }
        pdVar8[lVar9] = (double)CONCAT44(uVar12,uVar11);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + lVar10;
    } while (lVar7 != 3);
    if ((5 < lVar10) && (5 < lVar6)) {
      pdVar5 = pdVar5 + lVar10 * 3 + 3;
      lVar6 = 0;
      do {
        lVar7 = 0;
        do {
          uVar11 = 0xa0b5ed8d;
          uVar12 = 0x3eb0c6f7;
          if (lVar6 != lVar7) {
            uVar11 = 0;
            uVar12 = 0;
          }
          pdVar5[lVar7] = (double)CONCAT44(uVar12,uVar11);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        lVar6 = lVar6 + 1;
        pdVar5 = pdVar5 + lVar10;
      } while (lVar6 != 3);
      (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
        _vptr_FlexibilityEstimatorBase[0x22])(this);
      this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
      KalmanFilterBase::getQmatrixIdentity((Qmatrix *)&local_40,&this_00->super_KalmanFilterBase);
      pMVar4 = (Matrix *)
               (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)local_40.m_lhs;
      uVar1 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           local_40.m_rhs.m_rows.m_value;
      uVar2 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           local_40.m_rhs.m_cols.m_value;
      local_40.m_lhs = pMVar4;
      local_40.m_rhs.m_rows.m_value = uVar1;
      local_40.m_rhs.m_cols.m_value = uVar2;
      free(pMVar4);
      uVar1 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      uVar2 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      if (-1 < (long)(uVar2 | uVar1)) {
        pMVar4 = &this->Q_;
        local_40.m_rhs.m_functor.m_other = 1e-08;
        local_40.m_lhs = pMVar4;
        local_40.m_rhs.m_rows.m_value = uVar1;
        local_40.m_rhs.m_cols.m_value = uVar2;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                  (pMVar4,&local_40,(assign_op<double,_double> *)&local_58);
        lVar10 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        if ((lVar10 < 9) ||
           (lVar6 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols, lVar6 < 9)) goto LAB_0014b8a9;
        pdVar5 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        pdVar8 = pdVar5 + lVar10 * 6 + 6;
        lVar7 = 0;
        do {
          lVar9 = 0;
          do {
            uVar11 = 0xeb1c432d;
            uVar12 = 0x3f1a36e2;
            if (lVar7 != lVar9) {
              uVar11 = 0;
              uVar12 = 0;
            }
            pdVar8[lVar9] = (double)CONCAT44(uVar12,uVar11);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar7 = lVar7 + 1;
          pdVar8 = pdVar8 + lVar10;
        } while (lVar7 != 3);
        if ((lVar10 < 0xc) || (lVar6 < 0xc)) goto LAB_0014b8a9;
        pdVar8 = pdVar5 + lVar10 * 9 + 9;
        lVar7 = 0;
        do {
          lVar9 = 0;
          do {
            uVar11 = 0xeb1c432d;
            uVar12 = 0x3f1a36e2;
            if (lVar7 != lVar9) {
              uVar11 = 0;
              uVar12 = 0;
            }
            pdVar8[lVar9] = (double)CONCAT44(uVar12,uVar11);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar7 = lVar7 + 1;
          pdVar8 = pdVar8 + lVar10;
        } while (lVar7 != 3);
        if ((lVar10 < 0xf) || (lVar6 < 0xf)) goto LAB_0014b8a9;
        pdVar8 = pdVar5 + lVar10 * 0xc + 0xc;
        lVar7 = 0;
        do {
          lVar9 = 0;
          do {
            uVar11 = 0x47ae147b;
            uVar12 = 0x3f847ae1;
            if (lVar7 != lVar9) {
              uVar11 = 0;
              uVar12 = 0;
            }
            pdVar8[lVar9] = (double)CONCAT44(uVar12,uVar11);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar7 = lVar7 + 1;
          pdVar8 = pdVar8 + lVar10;
        } while (lVar7 != 3);
        if ((lVar10 < 0x12) || (lVar6 < 0x12)) goto LAB_0014b8a9;
        pdVar5 = pdVar5 + lVar10 * 0xf + 0xf;
        lVar6 = 0;
        do {
          lVar7 = 0;
          do {
            uVar11 = 0x47ae147b;
            uVar12 = 0x3f847ae1;
            if (lVar6 != lVar7) {
              uVar11 = 0;
              uVar12 = 0;
            }
            pdVar5[lVar7] = (double)CONCAT44(uVar12,uVar11);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          lVar6 = lVar6 + 1;
          pdVar5 = pdVar5 + lVar10;
        } while (lVar6 != 3);
        KalmanFilterBase::setQ(&this_00->super_KalmanFilterBase,pMVar4);
        KalmanFilterBase::getQmatrixIdentity(&local_58,&this_00->super_KalmanFilterBase);
        if (-1 < (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols |
                 local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_rows)) {
          local_40.m_rhs.m_rows.m_value =
               local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows;
          local_40.m_rhs.m_cols.m_value =
               local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols;
          local_40.m_rhs.m_functor.m_other = 0.01;
          local_40.m_lhs = &local_58;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                    (&local_58,&local_40,&local_59);
          if ((8 < local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows) &&
             (8 < local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols)) {
            pdVar5 = local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data +
                     local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 6 + 6;
            lVar10 = 0;
            do {
              lVar6 = 0;
              do {
                uVar11 = 0x47ae147b;
                uVar12 = 0x3f847ae1;
                if (lVar10 != lVar6) {
                  uVar11 = 0;
                  uVar12 = 0;
                }
                pdVar5[lVar6] = (double)CONCAT44(uVar12,uVar11);
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              lVar10 = lVar10 + 1;
              pdVar5 = pdVar5 + local_58.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows;
            } while (lVar10 != 3);
            if ((0xb < local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows) &&
               (0xb < local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols)) {
              pdVar5 = local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data +
                       local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows * 9 + 9;
              lVar10 = 0;
              do {
                lVar6 = 0;
                do {
                  uVar11 = 0x47ae147b;
                  uVar12 = 0x3f847ae1;
                  if (lVar10 != lVar6) {
                    uVar11 = 0;
                    uVar12 = 0;
                  }
                  pdVar5[lVar6] = (double)CONCAT44(uVar12,uVar11);
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 3);
                lVar10 = lVar10 + 1;
                pdVar5 = pdVar5 + local_58.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_rows;
              } while (lVar10 != 3);
              if ((0xe < local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_rows) &&
                 (0xe < local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols)) {
                pdVar5 = local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_data +
                         local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_rows * 0xc + 0xc;
                lVar10 = 0;
                do {
                  lVar6 = 0;
                  do {
                    uVar11 = 0x47ae147b;
                    uVar12 = 0x3f847ae1;
                    if (lVar10 != lVar6) {
                      uVar11 = 0;
                      uVar12 = 0;
                    }
                    pdVar5[lVar6] = (double)CONCAT44(uVar12,uVar11);
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 3);
                  lVar10 = lVar10 + 1;
                  pdVar5 = pdVar5 + local_58.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_rows;
                } while (lVar10 != 3);
                if ((0x11 < local_58.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows) &&
                   (0x11 < local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_storage.m_cols)) {
                  pdVar5 = local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_storage.m_data +
                           local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_storage.m_rows * 0xf + 0xf;
                  lVar10 = 0;
                  do {
                    lVar6 = 0;
                    do {
                      uVar11 = 0x47ae147b;
                      uVar12 = 0x3f847ae1;
                      if (lVar10 != lVar6) {
                        uVar11 = 0;
                        uVar12 = 0;
                      }
                      pdVar5[lVar6] = (double)CONCAT44(uVar12,uVar11);
                      lVar6 = lVar6 + 1;
                    } while (lVar6 != 3);
                    lVar10 = lVar10 + 1;
                    pdVar5 = pdVar5 + local_58.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                      .m_storage.m_rows;
                  } while (lVar10 != 3);
                  KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,&local_58);
                  free(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data);
                  return;
                }
              }
            }
          }
          goto LAB_0014b8a9;
        }
      }
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_0014b8f4;
    }
  }
LAB_0014b8a9:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

void FixedContactEKFFlexEstimatorIMU::resetCovarianceMatrices()
{
  R_ = Matrix::Identity(getMeasurementSize(), getMeasurementSize());
  R_.block(0, 0, 3, 3) = Matrix3::Identity() * 1.e-6; // accelerometer
  R_.block(3, 3, 3, 3) = Matrix3::Identity() * 1.e-6; // gyrometer

  updateCovarianceMatrix_();

  Q_ = ekf_.getQmatrixIdentity();
  Q_ = Q_ * 1.e-8;
  Q_.block(indexes::linVel, indexes::linVel, 3, 3) = Matrix3::Identity() * 1.e-4;
  Q_.block(indexes::angVel, indexes::angVel, 3, 3) = Matrix3::Identity() * 1.e-4;
  Q_.block(indexes::linAcc, indexes::linAcc, 3, 3) = Matrix3::Identity() * 1.e-2;
  Q_.block(indexes::angAcc, indexes::angAcc, 3, 3) = Matrix3::Identity() * 1.e-2;

  ekf_.setQ(Q_);

  Matrix P0(ekf_.getQmatrixIdentity());
  P0 = P0 * 1e-2;
  P0.block(indexes::linVel, indexes::linVel, 3, 3) = Matrix3::Identity() * 1.e-2;
  P0.block(indexes::angVel, indexes::angVel, 3, 3) = Matrix3::Identity() * 1.e-2;
  P0.block(indexes::linAcc, indexes::linAcc, 3, 3) = Matrix3::Identity() * 1.e-2;
  P0.block(indexes::angAcc, indexes::angAcc, 3, 3) = Matrix3::Identity() * 1.e-2;

  ekf_.setStateCovariance(P0);
}